

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::getNumberBlock(string *ustring,size_t *index)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  double dVar8;
  size_t ival;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  size_t local_68;
  double local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  double local_30;
  
  if (*(ustring->_M_dataplus)._M_p == '(') {
    local_68 = 1;
    bVar4 = segmentcheck(ustring,')',&local_68);
    if (!bVar4) {
      return NAN;
    }
    if (local_68 == 2) {
      *index = 2;
      return 1.0;
    }
    if (local_68 - 1 < 2) {
      bVar4 = false;
    }
    else {
      lVar5 = 0;
      bVar6 = false;
      do {
        bVar1 = (ustring->_M_dataplus)._M_p[lVar5 + 1];
        bVar4 = bVar6;
        if (9 < (byte)(bVar1 - 0x30)) {
          uVar7 = bVar1 - 0x28;
          if (0x3d < uVar7) {
            return NAN;
          }
          bVar4 = true;
          if (((0x40000000000087U >> ((ulong)uVar7 & 0x3f) & 1) == 0) &&
             (bVar4 = bVar6, (0x2000000000000060U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
            return NAN;
          }
        }
        lVar5 = lVar5 + 1;
        bVar6 = bVar4;
      } while (local_68 - 2 != lVar5);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,1,
               local_68 - 2);
    local_58 = 0;
    if (bVar4) {
      local_60 = generateLeadingNumber((string *)&local_50,&local_58);
    }
    else {
      local_60 = getDoubleFromString((string *)&local_50,&local_58);
    }
    sVar3 = local_58;
    if (local_50._M_string_length <= local_58) {
      *index = local_68;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (sVar3 < local_50._M_string_length) {
      return NAN;
    }
  }
  else {
    local_60 = getDoubleFromString(ustring,index);
  }
  if (NAN(local_60)) {
    return local_60;
  }
  uVar2 = *index;
  if (uVar2 < ustring->_M_string_length) {
    if ((ustring->_M_dataplus)._M_p[uVar2] != '^') {
      return local_60;
    }
    local_68 = 0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ustring,
               uVar2 + 1,0xffffffffffffffff);
    dVar8 = getNumberBlock((string *)&local_50,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      local_30 = dVar8;
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      dVar8 = local_30;
    }
    if (NAN(dVar8)) {
      *index = 0;
      return NAN;
    }
    *index = local_68 + *index + 1;
    dVar8 = pow(local_60,dVar8);
    return dVar8;
  }
  return local_60;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}